

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void countStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  sqlite3_value *psVar2;
  long *plVar3;
  
  plVar3 = (long *)sqlite3_aggregate_context(context,8);
  if (argc == 0) {
    if (plVar3 == (long *)0x0) {
      return;
    }
  }
  else {
    psVar2 = *argv;
    uVar1._0_2_ = psVar2->flags;
    uVar1._2_1_ = psVar2->enc;
    uVar1._3_1_ = psVar2->eSubtype;
    if ((0x5555555555555555U >> ((ulong)uVar1 & 0x3f) & 1) == 0 || plVar3 == (long *)0x0) {
      return;
    }
  }
  *plVar3 = *plVar3 + 1;
  return;
}

Assistant:

static void countStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, sizeof(*p));
  if( (argc==0 || SQLITE_NULL!=sqlite3_value_type(argv[0])) && p ){
    p->n++;
  }

#ifndef SQLITE_OMIT_DEPRECATED
  /* The sqlite3_aggregate_count() function is deprecated.  But just to make
  ** sure it still operates correctly, verify that its count agrees with our 
  ** internal count when using count(*) and when the total count can be
  ** expressed as a 32-bit integer. */
  assert( argc==1 || p==0 || p->n>0x7fffffff || p->bInverse
          || p->n==sqlite3_aggregate_count(context) );
#endif
}